

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

PortalImageInfiniteLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,Image *args_1,
          RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x208,8);
  construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (this,(PortalImageInfiniteLight *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3
             ,args_4,args_5,args_6);
  return (PortalImageInfiniteLight *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }